

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O2

void __thiscall
Diligent::SPIRVShaderResources::SPIRVShaderResources
          (SPIRVShaderResources *this,IMemoryAllocator *Allocator,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_binary,ShaderDesc *shaderDesc,
          char *CombinedSamplerSuffix,bool LoadShaderStageInputs,bool LoadUniformBufferReflection,
          string *EntryPoint)

{
  Dim DVar1;
  undefined8 *puVar2;
  uint uVar3;
  pointer RangeStart;
  pointer RangeEnd;
  bool bVar4;
  ExecutionModel model;
  uint32_t uVar5;
  string *psVar6;
  size_t sVar7;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSVar8;
  string *psVar9;
  SPIRType *pSVar10;
  SPIRVShaderResourceAttribs *pSVar11;
  char (*Args_1) [22];
  size_t sVar12;
  Char *pCVar13;
  SPIRVShaderStageInputAttribs *pSVar14;
  IMemoryAllocator *RawAllocator;
  char *Args_1_00;
  SPIRVShaderResources *Args_1_01;
  long lVar15;
  long lVar16;
  Resource *pRVar17;
  char *Args_2;
  Uint32 UVar18;
  long lVar19;
  Resource *ub;
  size_t sVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  EntryPoint *pEVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char (*in_stack_ffffffffffffced8) [17];
  string msg;
  StringPool ResourceNamesPool;
  vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  UBReflections;
  Source ParsedIRSource;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3058;
  ResourceCounters local_303c;
  SmallVector<diligent_spirv_cross::EntryPoint,_8UL> EntryPoints;
  ShaderResources resources;
  Compiler Compiler;
  Parser parser;
  
  this->m_StorageBufferOffset = 0;
  this->m_StorageImageOffset = 0;
  this->m_SampledImageOffset = 0;
  this->m_AtomicCounterOffset = 0;
  this->m_SeparateSamplerOffset = 0;
  this->m_SeparateImageOffset = 0;
  this->m_InputAttachmentOffset = 0;
  this->m_AccelStructOffset = 0;
  this->m_CombinedSamplerSuffix = (char *)0x0;
  this->m_ShaderName = (char *)0x0;
  (this->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  (this->m_MemoryBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false> =
       (_Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>)0x0;
  (this->m_MemoryBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  this->m_TotalResources = 0;
  this->m_NumShaderStageInputs = 0;
  this->m_ShaderType = shaderDesc->ShaderType;
  (this->m_ComputeGroupSize)._M_elems[0] = 0;
  (this->m_ComputeGroupSize)._M_elems[1] = 0;
  *(undefined8 *)((long)(this->m_ComputeGroupSize)._M_elems + 5) = 0;
  local_3058._M_impl.super__Vector_impl_data._M_start =
       (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_3058._M_impl.super__Vector_impl_data._M_finish =
       (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_3058._M_impl.super__Vector_impl_data._M_end_of_storage =
       (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (spirv_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Args_2 = CombinedSamplerSuffix;
  diligent_spirv_cross::Parser::Parser
            (&parser,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3058);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3058);
  diligent_spirv_cross::Parser::parse(&parser);
  ParsedIRSource = parser.ir.source;
  this->m_IsHLSLSource = parser.ir.source.hlsl;
  Args_1_00 = (char *)this;
  diligent_spirv_cross::Compiler::Compiler(&Compiler,&parser.ir);
  model = ShaderTypeToSpvExecutionModel(shaderDesc->ShaderType);
  diligent_spirv_cross::Compiler::get_entry_points_and_stages(&EntryPoints,&Compiler);
  pEVar21 = EntryPoints.super_VectorView<diligent_spirv_cross::EntryPoint>.ptr;
  for (lVar16 = EntryPoints.super_VectorView<diligent_spirv_cross::EntryPoint>.buffer_size * 0x28;
      lVar16 != 0; lVar16 = lVar16 + -0x28) {
    if (pEVar21->execution_model == model) {
      if (EntryPoint->_M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)EntryPoint);
      }
      else {
        msg._M_dataplus._M_p = GetShaderTypeLiteralName(shaderDesc->ShaderType);
        Args_1_00 = " found in SPIRV binary for shader \'";
        Args_2 = (char *)shaderDesc;
        FormatString<char[35],char_const*,char[36],char_const*,char[20],std::__cxx11::string,char[17]>
                  ((string *)&resources,(Diligent *)"More than one entry point of type ",
                   (char (*) [35])&msg,(char **)" found in SPIRV binary for shader \'",
                   (char (*) [36])shaderDesc,(char **)"\'. The first one (\'",
                   (char (*) [20])EntryPoint,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\') will be used.",in_stack_ffffffffffffced8);
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_1_00 = (char *)0x0;
          Args_2 = (char *)0x0;
          (*(code *)DebugMessageCallback)
                    (1,resources.uniform_buffers.super_VectorView<diligent_spirv_cross::Resource>.
                       ptr,0);
        }
        std::__cxx11::string::~string((string *)&resources);
      }
    }
    pEVar21 = pEVar21 + 1;
  }
  if (EntryPoint->_M_string_length == 0) {
    resources.uniform_buffers.super_VectorView<diligent_spirv_cross::Resource>.ptr =
         (Resource *)GetShaderTypeLiteralName(shaderDesc->ShaderType);
    Args_2 = "Unable to find entry point of type ";
    Args_1_00 = (char *)0x19c;
    LogError<true,char[36],char_const*,char[30],char_const*,char[2]>
              (false,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x19c,(char (*) [36])"Unable to find entry point of type ",(char **)&resources,
               (char (*) [30])0x5dc45f,(char **)shaderDesc,(char (*) [2])0x5abda9);
  }
  diligent_spirv_cross::Compiler::set_entry_point(&Compiler,EntryPoint,model);
  diligent_spirv_cross::Compiler::get_shader_resources(&resources,&Compiler);
  lVar16 = 0;
  pRVar17 = resources.uniform_buffers.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar19 = CONCAT44(resources.uniform_buffers.super_VectorView<diligent_spirv_cross::Resource>.
                         buffer_size._4_4_,
                         (Uint32)resources.uniform_buffers.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar19 != 0; lVar19 = lVar19 + -0x30) {
    psVar6 = GetUBName_abi_cxx11_(&Compiler,pRVar17,&ParsedIRSource);
    lVar16 = lVar16 + psVar6->_M_string_length + 1;
    pRVar17 = pRVar17 + 1;
  }
  msg._M_dataplus._M_p = (pointer)&resources.storage_buffers;
  msg._M_string_length = (size_type)&resources.storage_images;
  msg.field_2._M_allocated_capacity = (size_type)&resources.sampled_images;
  msg.field_2._8_8_ = &resources.atomic_counters;
  for (lVar19 = 0; lVar19 != 0x40; lVar19 = lVar19 + 8) {
    puVar2 = *(undefined8 **)((long)&msg._M_dataplus._M_p + lVar19);
    Args_1_00 = (char *)*puVar2;
    for (lVar15 = puVar2[1] * 0x30; lVar15 != 0; lVar15 = lVar15 + -0x30) {
      lVar16 = (long)(((SPIRVShaderResources *)Args_1_00)->m_UBReflectionBuffer)._M_t.
                     super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                     .super__Head_base<0UL,_void_*,_false>._M_head_impl + lVar16 + 1;
      Args_1_00 = (char *)&((SPIRVShaderResources *)Args_1_00)->m_StorageBufferOffset;
    }
  }
  if (CombinedSamplerSuffix != (char *)0x0) {
    sVar7 = strlen(CombinedSamplerSuffix);
    lVar16 = lVar16 + sVar7 + 1;
  }
  pCVar13 = (shaderDesc->super_DeviceObjectAttribs).Name;
  if (pCVar13 == (Char *)0x0) {
    FormatString<char[26],char[27]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"shaderDesc.Name != nullptr",(char (*) [27])Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x1bc);
    std::__cxx11::string::~string((string *)&msg);
    pCVar13 = (shaderDesc->super_DeviceObjectAttribs).Name;
  }
  sVar7 = strlen(pCVar13);
  sVar20 = lVar16 + sVar7 + 1;
  if ((resources.stage_inputs.super_VectorView<diligent_spirv_cross::Resource>.buffer_size != 0 &
       this->m_IsHLSLSource & LoadShaderStageInputs) == 1) {
    pSVar8 = diligent_spirv_cross::Compiler::get_declared_extensions_abi_cxx11_(&Compiler);
    __lhs = (pSVar8->
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).ptr;
    lVar16 = (pSVar8->
             super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).buffer_size << 5;
    do {
      if (lVar16 == 0) {
        if (this->m_IsHLSLSource == true) {
          FormatString<char[28],char_const*,char[366]>
                    (&msg,(Diligent *)"SPIRV byte code of shader \'",(char (*) [28])shaderDesc,
                     (char **)
                     "\' does not use SPV_GOOGLE_hlsl_functionality1 extension. As a result, it is not possible to get semantics of shader inputs and map them to proper locations. The shader will still work correctly if all attributes are declared in ascending order without any gaps. Enable SPV_GOOGLE_hlsl_functionality1 in your compiler to allow proper mapping of vertex shader inputs."
                     ,(char (*) [366])Args_2);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&msg);
        }
        goto LAB_002861ee;
      }
      bVar4 = std::operator==(__lhs,"SPV_GOOGLE_hlsl_functionality1");
      __lhs = __lhs + 1;
      lVar16 = lVar16 + -0x20;
    } while (!bVar4);
    Args_1 = (char (*) [22])0x0;
    pRVar17 = resources.stage_inputs.super_VectorView<diligent_spirv_cross::Resource>.ptr;
    for (lVar16 = resources.stage_inputs.super_VectorView<diligent_spirv_cross::Resource>.
                  buffer_size * 0x30; psVar6 = &pRVar17->name, lVar16 != 0; lVar16 = lVar16 + -0x30)
    {
      bVar4 = diligent_spirv_cross::Compiler::has_decoration
                        (&Compiler,(ID)*(uint32_t *)((long)(psVar6 + -1) + 0x10),
                         DecorationHlslSemanticGOOGLE);
      if (bVar4) {
        psVar9 = diligent_spirv_cross::Compiler::get_decoration_string_abi_cxx11_
                           (&Compiler,(ID)*(uint32_t *)((long)(psVar6 + -1) + 0x10),
                            DecorationHlslSemanticGOOGLE);
        sVar20 = sVar20 + psVar9->_M_string_length + 1;
        Args_1 = (char (*) [22])(ulong)((int)Args_1 + 1);
      }
      else {
        FormatString<char[15],std::__cxx11::string,char[141]>
                  (&msg,(Diligent *)"Shader input \'",(char (*) [15])psVar6,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' does not have DecorationHlslSemanticGOOGLE decoration, which is unexpected as the shader declares SPV_GOOGLE_hlsl_functionality1 extension"
                   ,(char (*) [141])Args_2);
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_2 = (char *)0x0;
          (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
      pRVar17 = (Resource *)(psVar6 + 1);
    }
    bVar4 = true;
  }
  else {
LAB_002861ee:
    Args_1 = (char (*) [22])0x0;
    bVar4 = false;
  }
  local_303c.NumUBs =
       (Uint32)resources.uniform_buffers.super_VectorView<diligent_spirv_cross::Resource>.
               buffer_size;
  local_303c.NumSBs =
       (Uint32)resources.storage_buffers.super_VectorView<diligent_spirv_cross::Resource>.
               buffer_size;
  local_303c.NumImgs =
       (Uint32)resources.storage_images.super_VectorView<diligent_spirv_cross::Resource>.buffer_size
  ;
  local_303c.NumSmpldImgs =
       (Uint32)resources.sampled_images.super_VectorView<diligent_spirv_cross::Resource>.buffer_size
  ;
  local_303c.NumACs =
       (Uint32)resources.atomic_counters.super_VectorView<diligent_spirv_cross::Resource>.
               buffer_size;
  local_303c.NumSepSmplrs =
       (Uint32)resources.separate_samplers.super_VectorView<diligent_spirv_cross::Resource>.
               buffer_size;
  local_303c.NumSepImgs =
       (Uint32)resources.separate_images.super_VectorView<diligent_spirv_cross::Resource>.
               buffer_size;
  local_303c.NumInptAtts =
       (Uint32)resources.subpass_inputs.super_VectorView<diligent_spirv_cross::Resource>.buffer_size
  ;
  local_303c.NumAccelStructs =
       (Uint32)resources.acceleration_structures.super_VectorView<diligent_spirv_cross::Resource>.
               buffer_size;
  ResourceNamesPool.m_ReservedSize = 0;
  ResourceNamesPool.m_pAllocator = (IMemoryAllocator *)0x0;
  ResourceNamesPool.m_pBuffer = (Char *)0x0;
  ResourceNamesPool.m_pCurrPtr = (Char *)0x0;
  Initialize(this,Allocator,&local_303c,(Uint32)Args_1,sVar20,&ResourceNamesPool);
  UBReflections.
  super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  UBReflections.
  super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  UBReflections.
  super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UVar18 = 0;
  pRVar17 = resources.uniform_buffers.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar16 = CONCAT44(resources.uniform_buffers.super_VectorView<diligent_spirv_cross::Resource>.
                         buffer_size._4_4_,
                         (Uint32)resources.uniform_buffers.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
    psVar6 = GetUBName_abi_cxx11_(&Compiler,pRVar17,&ParsedIRSource);
    pSVar10 = diligent_spirv_cross::Compiler::get_type(&Compiler,(TypeID)(pRVar17->type_id).id);
    sVar20 = diligent_spirv_cross::Compiler::get_declared_struct_size(&Compiler,pSVar10);
    pSVar11 = GetUB(this,UVar18);
    Args_1 = (char (*) [22])StringPool::CopyString(&ResourceNamesPool,psVar6);
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar11,&Compiler,pRVar17,(char *)Args_1,UniformBuffer,(Uint32)sVar20,0);
    if (LoadUniformBufferReflection) {
      Args_1 = (char (*) [22])(ulong)this->m_IsHLSLSource;
      LoadUBReflection((ShaderCodeBufferDescX *)&msg,&Compiler,pRVar17,this->m_IsHLSLSource);
      std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
      ::emplace_back<Diligent::ShaderCodeBufferDescX>(&UBReflections,(ShaderCodeBufferDescX *)&msg);
      std::
      vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
      ::~vector((vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                 *)&msg.field_2);
    }
    pRVar17 = pRVar17 + 1;
    UVar18 = UVar18 + 1;
  }
  if (this->m_StorageBufferOffset != UVar18) {
    FormatString<char[26],char[22]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"CurrUB == GetNumUBs()",
               Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x214);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar18 = 0;
  pRVar17 = resources.storage_buffers.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar16 = CONCAT44(resources.storage_buffers.super_VectorView<diligent_spirv_cross::Resource>.
                         buffer_size._4_4_,
                         (Uint32)resources.storage_buffers.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
    diligent_spirv_cross::Compiler::get_buffer_block_flags
              ((Bitset *)&msg,&Compiler,(VariableID)(pRVar17->id).id);
    uVar3 = (uint)msg._M_dataplus._M_p >> 0x18;
    pSVar10 = diligent_spirv_cross::Compiler::get_type(&Compiler,(TypeID)(pRVar17->type_id).id);
    sVar20 = diligent_spirv_cross::Compiler::get_declared_struct_size(&Compiler,pSVar10);
    sVar12 = diligent_spirv_cross::Compiler::get_declared_struct_size_runtime_array
                       (&Compiler,pSVar10,1);
    pSVar11 = GetSB(this,UVar18);
    pCVar13 = StringPool::CopyString(&ResourceNamesPool,&pRVar17->name);
    UVar18 = UVar18 + 1;
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar11,&Compiler,pRVar17,pCVar13,RWStorageBuffer - ((uVar3 & 1) != 0),(Uint32)sVar20
               ,(int)sVar12 - (Uint32)sVar20);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&msg._M_string_length);
    pRVar17 = pRVar17 + 1;
  }
  if ((uint)this->m_StorageImageOffset - (uint)this->m_StorageBufferOffset != UVar18) {
    FormatString<char[26],char[22]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"CurrSB == GetNumSBs()",
               (char (*) [22])(ulong)this->m_StorageBufferOffset);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x22d);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar18 = 0;
  pRVar17 = resources.sampled_images.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar16 = CONCAT44(resources.sampled_images.super_VectorView<diligent_spirv_cross::Resource>.
                         buffer_size._4_4_,
                         (Uint32)resources.sampled_images.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
    pSVar10 = diligent_spirv_cross::Compiler::get_type(&Compiler,(TypeID)(pRVar17->type_id).id);
    DVar1 = (pSVar10->image).dim;
    pSVar11 = GetSmpldImg(this,UVar18);
    pCVar13 = StringPool::CopyString(&ResourceNamesPool,&pRVar17->name);
    UVar18 = UVar18 + 1;
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar11,&Compiler,pRVar17,pCVar13,(DVar1 != Buffer) * '\x03' + UniformTexelBuffer,0,0
              );
    pRVar17 = pRVar17 + 1;
  }
  if ((uint)this->m_AtomicCounterOffset - (uint)this->m_SampledImageOffset != UVar18) {
    FormatString<char[26],char[33]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSmplImg == GetNumSmpldImgs()",
               (char (*) [33])(ulong)this->m_SampledImageOffset);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x240);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar18 = 0;
  pRVar17 = resources.storage_images.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar16 = CONCAT44(resources.storage_images.super_VectorView<diligent_spirv_cross::Resource>.
                         buffer_size._4_4_,
                         (Uint32)resources.storage_images.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
    pSVar10 = diligent_spirv_cross::Compiler::get_type(&Compiler,(TypeID)(pRVar17->type_id).id);
    DVar1 = (pSVar10->image).dim;
    pSVar11 = GetImg(this,UVar18);
    pCVar13 = StringPool::CopyString(&ResourceNamesPool,&pRVar17->name);
    UVar18 = UVar18 + 1;
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar11,&Compiler,pRVar17,pCVar13,DVar1 == Buffer ^ StorageImage,0,0);
    pRVar17 = pRVar17 + 1;
  }
  if ((uint)this->m_SampledImageOffset - (uint)this->m_StorageImageOffset != UVar18) {
    FormatString<char[26],char[24]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrImg == GetNumImgs()",
               (char (*) [24])(ulong)this->m_StorageImageOffset);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x253);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar18 = 0;
  pRVar17 = resources.atomic_counters.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar16 = CONCAT44(resources.atomic_counters.super_VectorView<diligent_spirv_cross::Resource>.
                         buffer_size._4_4_,
                         (Uint32)resources.atomic_counters.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
    pSVar11 = GetAC(this,UVar18);
    pCVar13 = StringPool::CopyString(&ResourceNamesPool,&pRVar17->name);
    UVar18 = UVar18 + 1;
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar11,&Compiler,pRVar17,pCVar13,AtomicCounter,0,0);
    pRVar17 = pRVar17 + 1;
  }
  if ((uint)this->m_SeparateSamplerOffset - (uint)this->m_AtomicCounterOffset != UVar18) {
    FormatString<char[26],char[22]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"CurrAC == GetNumACs()",
               (char (*) [22])(ulong)this->m_AtomicCounterOffset);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x262);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar18 = 0;
  pRVar17 = resources.separate_samplers.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar16 = CONCAT44(resources.separate_samplers.
                         super_VectorView<diligent_spirv_cross::Resource>.buffer_size._4_4_,
                         (Uint32)resources.separate_samplers.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
    pSVar11 = GetSepSmplr(this,UVar18);
    pCVar13 = StringPool::CopyString(&ResourceNamesPool,&pRVar17->name);
    UVar18 = UVar18 + 1;
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar11,&Compiler,pRVar17,pCVar13,SeparateSampler,0,0);
    pRVar17 = pRVar17 + 1;
  }
  if ((uint)this->m_SeparateImageOffset - (uint)this->m_SeparateSamplerOffset != UVar18) {
    FormatString<char[26],char[33]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSepSmpl == GetNumSepSmplrs()",
               (char (*) [33])(ulong)this->m_SeparateSamplerOffset);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x271);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar18 = 0;
  pRVar17 = resources.separate_images.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar16 = CONCAT44(resources.separate_images.super_VectorView<diligent_spirv_cross::Resource>.
                         buffer_size._4_4_,
                         (Uint32)resources.separate_images.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
    pSVar10 = diligent_spirv_cross::Compiler::get_type(&Compiler,(TypeID)(pRVar17->type_id).id);
    DVar1 = (pSVar10->image).dim;
    pSVar11 = GetSepImg(this,UVar18);
    pCVar13 = StringPool::CopyString(&ResourceNamesPool,&pRVar17->name);
    UVar18 = UVar18 + 1;
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar11,&Compiler,pRVar17,pCVar13,(DVar1 != Buffer) * '\x05' + UniformTexelBuffer,0,0
              );
    pRVar17 = pRVar17 + 1;
  }
  if ((uint)this->m_InputAttachmentOffset - (uint)this->m_SeparateImageOffset != UVar18) {
    FormatString<char[26],char[30]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSepImg == GetNumSepImgs()",
               (char (*) [30])(ulong)this->m_SeparateImageOffset);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x285);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar18 = 0;
  pRVar17 = resources.subpass_inputs.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar16 = CONCAT44(resources.subpass_inputs.super_VectorView<diligent_spirv_cross::Resource>.
                         buffer_size._4_4_,
                         (Uint32)resources.subpass_inputs.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
    pSVar11 = GetInptAtt(this,UVar18);
    pCVar13 = StringPool::CopyString(&ResourceNamesPool,&pRVar17->name);
    UVar18 = UVar18 + 1;
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar11,&Compiler,pRVar17,pCVar13,InputAttachment,0,0);
    pRVar17 = pRVar17 + 1;
  }
  if ((uint)this->m_AccelStructOffset - (uint)this->m_InputAttachmentOffset != UVar18) {
    FormatString<char[26],char[37]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrSubpassInput == GetNumInptAtts()",
               (char (*) [37])(ulong)this->m_InputAttachmentOffset);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x294);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar18 = 0;
  pRVar17 = resources.acceleration_structures.super_VectorView<diligent_spirv_cross::Resource>.ptr;
  for (lVar16 = CONCAT44(resources.acceleration_structures.
                         super_VectorView<diligent_spirv_cross::Resource>.buffer_size._4_4_,
                         (Uint32)resources.acceleration_structures.
                                 super_VectorView<diligent_spirv_cross::Resource>.buffer_size) *
                0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
    pSVar11 = GetAccelStruct(this,UVar18);
    pCVar13 = StringPool::CopyString(&ResourceNamesPool,&pRVar17->name);
    UVar18 = UVar18 + 1;
    SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
              (pSVar11,&Compiler,pRVar17,pCVar13,AccelerationStructure,0,0);
    pRVar17 = pRVar17 + 1;
  }
  if ((uint)this->m_TotalResources - (uint)this->m_AccelStructOffset != UVar18) {
    FormatString<char[26],char[40]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrAccelStruct == GetNumAccelStructs()",
               (char (*) [40])(ulong)this->m_AccelStructOffset);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x2a3);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (CombinedSamplerSuffix != (char *)0x0) {
    pCVar13 = StringPool::CopyString(&ResourceNamesPool,CombinedSamplerSuffix);
    this->m_CombinedSamplerSuffix = pCVar13;
  }
  pCVar13 = StringPool::CopyString(&ResourceNamesPool,(shaderDesc->super_DeviceObjectAttribs).Name);
  this->m_ShaderName = pCVar13;
  Args_1_01 = this;
  if (bVar4) {
    UVar18 = 0;
    pRVar17 = resources.stage_inputs.super_VectorView<diligent_spirv_cross::Resource>.ptr;
    for (lVar16 = resources.stage_inputs.super_VectorView<diligent_spirv_cross::Resource>.
                  buffer_size * 0x30; lVar16 != 0; lVar16 = lVar16 + -0x30) {
      bVar4 = diligent_spirv_cross::Compiler::has_decoration
                        (&Compiler,(ID)(pRVar17->id).id,DecorationHlslSemanticGOOGLE);
      if (bVar4) {
        psVar6 = diligent_spirv_cross::Compiler::get_decoration_string_abi_cxx11_
                           (&Compiler,(ID)(pRVar17->id).id,DecorationHlslSemanticGOOGLE);
        pSVar14 = GetShaderStageInputAttribs(this,UVar18);
        pCVar13 = StringPool::CopyString(&ResourceNamesPool,psVar6);
        uVar5 = GetDecorationOffset(&Compiler,pRVar17,DecorationLocation);
        UVar18 = UVar18 + 1;
        pSVar14->Semantic = pCVar13;
        pSVar14->LocationDecorationOffset = uVar5;
      }
      pRVar17 = pRVar17 + 1;
    }
    if (UVar18 != this->m_NumShaderStageInputs) {
      FormatString<char[26],char[44]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CurrStageInput == GetNumShaderStageInputs()",
                 (char (*) [44])Args_1_01);
      Args_1_01 = (SPIRVShaderResources *)0x2be;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SPIRVShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x2be);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  sVar20 = StringPool::GetRemainingSize(&ResourceNamesPool);
  if (sVar20 != 0) {
    FormatString<char[25]>(&msg,(char (*) [25])"Names pool must be empty");
    Args_1_01 = (SPIRVShaderResources *)0x2c1;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SPIRVShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x2c1);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (shaderDesc->ShaderType == SHADER_TYPE_COMPUTE) {
    for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
      uVar5 = diligent_spirv_cross::Compiler::get_execution_mode_argument
                        (&Compiler,ExecutionModeLocalSize,(uint32_t)lVar16);
      (this->m_ComputeGroupSize)._M_elems[lVar16] = uVar5;
    }
  }
  if (UBReflections.
      super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      UBReflections.
      super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (!LoadUniformBufferReflection) {
      FormatString<char[26],char[28]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"LoadUniformBufferReflection",(char (*) [28])Args_1_01);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SPIRVShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x2cb);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((char (*) [36])
        (((long)UBReflections.
                super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)UBReflections.
               super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x28) !=
        (char (*) [36])(ulong)this->m_StorageBufferOffset) {
      FormatString<char[26],char[36]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"UBReflections.size() == GetNumUBs()",
                 (char (*) [36])(ulong)this->m_StorageBufferOffset);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SPIRVShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
                 ,0x2cc);
      std::__cxx11::string::~string((string *)&msg);
    }
    RangeEnd = UBReflections.
               super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    RangeStart = UBReflections.
                 super__Vector_base<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    RawAllocator = GetRawAllocator();
    ShaderCodeBufferDescX::
    PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
              ((ShaderCodeBufferDescX *)&msg,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeStart,
               (__normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
                )RangeEnd,RawAllocator);
    std::__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
              ((__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
               &this->m_UBReflectionBuffer,
               (__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
               &msg);
    std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
              ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)&msg);
  }
  std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
  ~vector(&UBReflections);
  StringPool::~StringPool(&ResourceNamesPool);
  diligent_spirv_cross::ShaderResources::~ShaderResources(&resources);
  diligent_spirv_cross::SmallVector<diligent_spirv_cross::EntryPoint,_8UL>::~SmallVector
            (&EntryPoints);
  diligent_spirv_cross::Compiler::~Compiler(&Compiler);
  diligent_spirv_cross::Parser::~Parser(&parser);
  return;
}

Assistant:

SPIRVShaderResources::SPIRVShaderResources(IMemoryAllocator&     Allocator,
                                           std::vector<uint32_t> spirv_binary,
                                           const ShaderDesc&     shaderDesc,
                                           const char*           CombinedSamplerSuffix,
                                           bool                  LoadShaderStageInputs,
                                           bool                  LoadUniformBufferReflection,
                                           std::string&          EntryPoint) noexcept(false) :
    m_ShaderType{shaderDesc.ShaderType}
{
    // https://github.com/KhronosGroup/SPIRV-Cross/wiki/Reflection-API-user-guide
    diligent_spirv_cross::Parser parser{std::move(spirv_binary)};
    parser.parse();
    const auto ParsedIRSource = parser.get_parsed_ir().source;
    m_IsHLSLSource            = ParsedIRSource.hlsl;
    diligent_spirv_cross::Compiler Compiler{std::move(parser.get_parsed_ir())};

    spv::ExecutionModel ExecutionModel = ShaderTypeToSpvExecutionModel(shaderDesc.ShaderType);
    auto                EntryPoints    = Compiler.get_entry_points_and_stages();
    for (const auto& CurrEntryPoint : EntryPoints)
    {
        if (CurrEntryPoint.execution_model == ExecutionModel)
        {
            if (!EntryPoint.empty())
            {
                LOG_WARNING_MESSAGE("More than one entry point of type ", GetShaderTypeLiteralName(shaderDesc.ShaderType), " found in SPIRV binary for shader '", shaderDesc.Name, "'. The first one ('", EntryPoint, "') will be used.");
            }
            else
            {
                EntryPoint = CurrEntryPoint.name;
            }
        }
    }
    if (EntryPoint.empty())
    {
        LOG_ERROR_AND_THROW("Unable to find entry point of type ", GetShaderTypeLiteralName(shaderDesc.ShaderType), " in SPIRV binary for shader '", shaderDesc.Name, "'");
    }
    Compiler.set_entry_point(EntryPoint, ExecutionModel);

    // The SPIR-V is now parsed, and we can perform reflection on it.
    diligent_spirv_cross::ShaderResources resources = Compiler.get_shader_resources();

    size_t ResourceNamesPoolSize = 0;
    for (const auto& ub : resources.uniform_buffers)
        ResourceNamesPoolSize += GetUBName(Compiler, ub, ParsedIRSource).length() + 1;
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please account for the new resource type below");
    for (auto* pResType :
         {
             &resources.storage_buffers,
             &resources.storage_images,
             &resources.sampled_images,
             &resources.atomic_counters,
             &resources.separate_images,
             &resources.separate_samplers,
             &resources.subpass_inputs,
             &resources.acceleration_structures //
         })                                     //
    {
        for (const auto& res : *pResType)
            ResourceNamesPoolSize += res.name.length() + 1;
    }

    if (CombinedSamplerSuffix != nullptr)
    {
        ResourceNamesPoolSize += strlen(CombinedSamplerSuffix) + 1;
    }

    VERIFY_EXPR(shaderDesc.Name != nullptr);
    ResourceNamesPoolSize += strlen(shaderDesc.Name) + 1;

    Uint32 NumShaderStageInputs = 0;

    if (!m_IsHLSLSource || resources.stage_inputs.empty())
        LoadShaderStageInputs = false;
    if (LoadShaderStageInputs)
    {
        const auto& Extensions         = Compiler.get_declared_extensions();
        bool        HlslFunctionality1 = false;
        for (const auto& ext : Extensions)
        {
            HlslFunctionality1 = (ext == "SPV_GOOGLE_hlsl_functionality1");
            if (HlslFunctionality1)
                break;
        }

        if (HlslFunctionality1)
        {
            for (const auto& Input : resources.stage_inputs)
            {
                if (Compiler.has_decoration(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE))
                {
                    const auto& Semantic = Compiler.get_decoration_string(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE);
                    ResourceNamesPoolSize += Semantic.length() + 1;
                    ++NumShaderStageInputs;
                }
                else
                {
                    LOG_ERROR_MESSAGE("Shader input '", Input.name, "' does not have DecorationHlslSemanticGOOGLE decoration, which is unexpected as the shader declares SPV_GOOGLE_hlsl_functionality1 extension");
                }
            }
        }
        else
        {
            LoadShaderStageInputs = false;
            if (m_IsHLSLSource)
            {
                LOG_WARNING_MESSAGE("SPIRV byte code of shader '", shaderDesc.Name,
                                    "' does not use SPV_GOOGLE_hlsl_functionality1 extension. "
                                    "As a result, it is not possible to get semantics of shader inputs and map them to proper locations. "
                                    "The shader will still work correctly if all attributes are declared in ascending order without any gaps. "
                                    "Enable SPV_GOOGLE_hlsl_functionality1 in your compiler to allow proper mapping of vertex shader inputs.");
            }
        }
    }

    ResourceCounters ResCounters;
    ResCounters.NumUBs          = static_cast<Uint32>(resources.uniform_buffers.size());
    ResCounters.NumSBs          = static_cast<Uint32>(resources.storage_buffers.size());
    ResCounters.NumImgs         = static_cast<Uint32>(resources.storage_images.size());
    ResCounters.NumSmpldImgs    = static_cast<Uint32>(resources.sampled_images.size());
    ResCounters.NumACs          = static_cast<Uint32>(resources.atomic_counters.size());
    ResCounters.NumSepSmplrs    = static_cast<Uint32>(resources.separate_samplers.size());
    ResCounters.NumSepImgs      = static_cast<Uint32>(resources.separate_images.size());
    ResCounters.NumInptAtts     = static_cast<Uint32>(resources.subpass_inputs.size());
    ResCounters.NumAccelStructs = static_cast<Uint32>(resources.acceleration_structures.size());
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please set the new resource type counter here");

    // Resource names pool is only needed to facilitate string allocation.
    StringPool ResourceNamesPool;
    Initialize(Allocator, ResCounters, NumShaderStageInputs, ResourceNamesPoolSize, ResourceNamesPool);

    // Uniform buffer reflections
    std::vector<ShaderCodeBufferDescX> UBReflections;

    {
        Uint32 CurrUB = 0;
        for (const auto& UB : resources.uniform_buffers)
        {
            const auto& name = GetUBName(Compiler, UB, ParsedIRSource);
            const auto& Type = Compiler.get_type(UB.type_id);
            const auto  Size = Compiler.get_declared_struct_size(Type);
            new (&GetUB(CurrUB++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    UB,
                    ResourceNamesPool.CopyString(name),
                    SPIRVShaderResourceAttribs::ResourceType::UniformBuffer,
                    static_cast<Uint32>(Size) //
                };

            if (LoadUniformBufferReflection)
            {
                UBReflections.emplace_back(LoadUBReflection(Compiler, UB, m_IsHLSLSource));
            }
        }
        VERIFY_EXPR(CurrUB == GetNumUBs());
    }

    {
        Uint32 CurrSB = 0;
        for (const auto& SB : resources.storage_buffers)
        {
            auto BufferFlags = Compiler.get_buffer_block_flags(SB.id);
            auto IsReadOnly  = BufferFlags.get(spv::DecorationNonWritable);
            auto ResType     = IsReadOnly ?
                SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer :
                SPIRVShaderResourceAttribs::ResourceType::RWStorageBuffer;
            const auto& Type   = Compiler.get_type(SB.type_id);
            const auto  Size   = Compiler.get_declared_struct_size(Type);
            const auto  Stride = Compiler.get_declared_struct_size_runtime_array(Type, 1) - Size;
            new (&GetSB(CurrSB++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SB,
                    ResourceNamesPool.CopyString(SB.name),
                    ResType,
                    static_cast<Uint32>(Size),
                    static_cast<Uint32>(Stride) //
                };
        }
        VERIFY_EXPR(CurrSB == GetNumSBs());
    }

    {
        Uint32 CurrSmplImg = 0;
        for (const auto& SmplImg : resources.sampled_images)
        {
            const auto& type    = Compiler.get_type(SmplImg.type_id);
            auto        ResType = type.image.dim == spv::DimBuffer ?
                SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer :
                SPIRVShaderResourceAttribs::ResourceType::SampledImage;
            new (&GetSmpldImg(CurrSmplImg++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SmplImg,
                    ResourceNamesPool.CopyString(SmplImg.name),
                    ResType //
                };
        }
        VERIFY_EXPR(CurrSmplImg == GetNumSmpldImgs());
    }

    {
        Uint32 CurrImg = 0;
        for (const auto& Img : resources.storage_images)
        {
            const auto& type    = Compiler.get_type(Img.type_id);
            auto        ResType = type.image.dim == spv::DimBuffer ?
                SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer :
                SPIRVShaderResourceAttribs::ResourceType::StorageImage;
            new (&GetImg(CurrImg++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    Img,
                    ResourceNamesPool.CopyString(Img.name),
                    ResType //
                };
        }
        VERIFY_EXPR(CurrImg == GetNumImgs());
    }

    {
        Uint32 CurrAC = 0;
        for (const auto& AC : resources.atomic_counters)
        {
            new (&GetAC(CurrAC++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    AC,
                    ResourceNamesPool.CopyString(AC.name),
                    SPIRVShaderResourceAttribs::ResourceType::AtomicCounter //
                };
        }
        VERIFY_EXPR(CurrAC == GetNumACs());
    }

    {
        Uint32 CurrSepSmpl = 0;
        for (const auto& SepSam : resources.separate_samplers)
        {
            new (&GetSepSmplr(CurrSepSmpl++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SepSam,
                    ResourceNamesPool.CopyString(SepSam.name),
                    SPIRVShaderResourceAttribs::ResourceType::SeparateSampler //
                };
        }
        VERIFY_EXPR(CurrSepSmpl == GetNumSepSmplrs());
    }

    {
        Uint32 CurrSepImg = 0;
        for (const auto& SepImg : resources.separate_images)
        {
            const auto& type    = Compiler.get_type(SepImg.type_id);
            const auto  ResType = type.image.dim == spv::DimBuffer ?
                SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer :
                SPIRVShaderResourceAttribs::ResourceType::SeparateImage;

            new (&GetSepImg(CurrSepImg++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SepImg,
                    ResourceNamesPool.CopyString(SepImg.name),
                    ResType //
                };
        }
        VERIFY_EXPR(CurrSepImg == GetNumSepImgs());
    }

    {
        Uint32 CurrSubpassInput = 0;
        for (const auto& SubpassInput : resources.subpass_inputs)
        {
            new (&GetInptAtt(CurrSubpassInput++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    SubpassInput,
                    ResourceNamesPool.CopyString(SubpassInput.name),
                    SPIRVShaderResourceAttribs::ResourceType::InputAttachment //
                };
        }
        VERIFY_EXPR(CurrSubpassInput == GetNumInptAtts());
    }

    {
        Uint32 CurrAccelStruct = 0;
        for (const auto& AccelStruct : resources.acceleration_structures)
        {
            new (&GetAccelStruct(CurrAccelStruct++)) SPIRVShaderResourceAttribs //
                {
                    Compiler,
                    AccelStruct,
                    ResourceNamesPool.CopyString(AccelStruct.name),
                    SPIRVShaderResourceAttribs::ResourceType::AccelerationStructure //
                };
        }
        VERIFY_EXPR(CurrAccelStruct == GetNumAccelStructs());
    }

    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please initialize SPIRVShaderResourceAttribs for the new resource type here");

    if (CombinedSamplerSuffix != nullptr)
    {
        m_CombinedSamplerSuffix = ResourceNamesPool.CopyString(CombinedSamplerSuffix);
    }

    m_ShaderName = ResourceNamesPool.CopyString(shaderDesc.Name);

    if (LoadShaderStageInputs)
    {
        Uint32 CurrStageInput = 0;
        for (const auto& Input : resources.stage_inputs)
        {
            if (Compiler.has_decoration(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE))
            {
                const auto& Semantic = Compiler.get_decoration_string(Input.id, spv::Decoration::DecorationHlslSemanticGOOGLE);
                new (&GetShaderStageInputAttribs(CurrStageInput++)) SPIRVShaderStageInputAttribs //
                    {
                        ResourceNamesPool.CopyString(Semantic),
                        GetDecorationOffset(Compiler, Input, spv::Decoration::DecorationLocation) //
                    };
            }
        }
        VERIFY_EXPR(CurrStageInput == GetNumShaderStageInputs());
    }

    VERIFY(ResourceNamesPool.GetRemainingSize() == 0, "Names pool must be empty");

    if (shaderDesc.ShaderType == SHADER_TYPE_COMPUTE)
    {
        for (uint32_t i = 0; i < m_ComputeGroupSize.size(); ++i)
            m_ComputeGroupSize[i] = Compiler.get_execution_mode_argument(spv::ExecutionModeLocalSize, i);
    }

    if (!UBReflections.empty())
    {
        VERIFY_EXPR(LoadUniformBufferReflection);
        VERIFY_EXPR(UBReflections.size() == GetNumUBs());
        m_UBReflectionBuffer = ShaderCodeBufferDescX::PackArray(UBReflections.cbegin(), UBReflections.cend(), GetRawAllocator());
    }
    //LOG_INFO_MESSAGE(DumpResources());
}